

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

void update_Z_and_wbar(update_data_conflict *data,float x,float *wref)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  
  iVar1 = data->ON->m;
  if (data->ON->normalize == true) {
    fVar3 = wref[(long)iVar1 + 1];
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    x = x / fVar3;
  }
  fVar3 = x * data->sketch_cnt;
  if (0 < iVar1) {
    uVar2 = 1;
    do {
      wref[uVar2] = (data->delta[uVar2] * fVar3) / data->ON->D[uVar2] + wref[uVar2];
      uVar2 = uVar2 + 1;
    } while (iVar1 + 1 != uVar2);
  }
  *wref = *wref - fVar3 * data->bdelta;
  return;
}

Assistant:

void update_Z_and_wbar(update_data& data, float x, float& wref)
{
  float* w = &wref;
  int m = data.ON->m;
  if (data.ON->normalize)
    x /= sqrt(w[NORM2]);
  float s = data.sketch_cnt * x;

  for (int i = 1; i <= m; i++)
  {
    w[i] += data.delta[i] * s / data.ON->D[i];
  }
  w[0] -= s * data.bdelta;
}